

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O1

bool __thiscall FIX::SessionState::needTestRequest(SessionState *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int local_20;
  long local_18;
  
  DateTime::nowUtc();
  iVar1 = (this->m_lastReceivedTime).super_DateTime.m_date;
  auVar3 = SEXT816(-0x112e0be826d694b3) * SEXT816((this->m_lastReceivedTime).super_DateTime.m_time);
  iVar2 = this->m_testRequest;
  iVar4 = IntField::getValue(&(this->m_heartBtInt).super_IntField);
  return (double)iVar4 * ((double)iVar2 + 1.0) * 1.2 <=
         (double)(((int)(auVar3._8_8_ >> 0x1a) - (auVar3._12_4_ >> 0x1f)) +
                  ((int)(SUB168(SEXT816(0x112e0be826d694b3) * SEXT816(local_18),8) >> 0x1a) -
                  (SUB164(SEXT816(0x112e0be826d694b3) * SEXT816(local_18),0xc) >> 0x1f)) +
                 (local_20 - iVar1) * 0x15180);
}

Assistant:

bool needTestRequest() const
  {
    UtcTimeStamp now;
    return ( now - lastReceivedTime() ) >=
           ( ( 1.2 * ( ( double ) testRequest() + 1 ) ) * ( double ) heartBtInt() );
  }